

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.hpp
# Opt level: O1

void __thiscall
nite::Program::Program(Program *this,int id,Uniform *uniforms,string *name,Shader *ref)

{
  Uniform *pUVar1;
  
  (this->shaderName)._M_dataplus._M_p = (pointer)&(this->shaderName).field_2;
  (this->shaderName)._M_string_length = 0;
  (this->shaderName).field_2._M_local_buf[0] = '\0';
  pUVar1 = &this->uniforms;
  (this->uniforms).shaderName._M_dataplus._M_p = (pointer)&(this->uniforms).shaderName.field_2;
  (this->uniforms).shaderName._M_string_length = 0;
  (this->uniforms).shaderName.field_2._M_local_buf[0] = '\0';
  (this->uniforms).floats._M_h._M_buckets = &(this->uniforms).floats._M_h._M_single_bucket;
  (this->uniforms).floats._M_h._M_bucket_count = 1;
  (this->uniforms).floats._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uniforms).floats._M_h._M_element_count = 0;
  (this->uniforms).floats._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->uniforms).floats._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uniforms).floats._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->uniforms).integers._M_h._M_buckets = &(this->uniforms).integers._M_h._M_single_bucket;
  (this->uniforms).integers._M_h._M_bucket_count = 1;
  (this->uniforms).integers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uniforms).integers._M_h._M_element_count = 0;
  (this->uniforms).integers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->uniforms).integers._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uniforms).integers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->uniforms).vectors._M_h._M_buckets = &(this->uniforms).vectors._M_h._M_single_bucket;
  (this->uniforms).vectors._M_h._M_bucket_count = 1;
  (this->uniforms).vectors._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uniforms).vectors._M_h._M_element_count = 0;
  (this->uniforms).vectors._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->uniforms).vectors._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uniforms).vectors._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->uniforms).colors._M_h._M_buckets = &(this->uniforms).colors._M_h._M_single_bucket;
  (this->uniforms).colors._M_h._M_bucket_count = 1;
  (this->uniforms).colors._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uniforms).colors._M_h._M_element_count = 0;
  (this->uniforms).colors._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->uniforms).colors._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uniforms).colors._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->id = id;
  std::__cxx11::string::_M_assign((string *)pUVar1);
  if (pUVar1 != uniforms) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,float>,std::allocator<std::pair<std::__cxx11::string_const,float>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,float>,std::allocator<std::pair<std::__cxx11::string_const,float>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,float>,std::allocator<std::pair<std::__cxx11::string_const,float>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->uniforms).floats,&(uniforms->floats)._M_h);
    if (pUVar1 != uniforms) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&(this->uniforms).integers,&(uniforms->integers)._M_h);
      if (pUVar1 != uniforms) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nite::Vec2>,std::allocator<std::pair<std::__cxx11::string_const,nite::Vec2>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nite::Vec2>,std::allocator<std::pair<std::__cxx11::string_const,nite::Vec2>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nite::Vec2>,std::allocator<std::pair<std::__cxx11::string_const,nite::Vec2>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&(this->uniforms).vectors,&(uniforms->vectors)._M_h);
        if (pUVar1 != uniforms) {
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nite::Color>,std::allocator<std::pair<std::__cxx11::string_const,nite::Color>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nite::Color>,std::allocator<std::pair<std::__cxx11::string_const,nite::Color>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nite::Color>,std::allocator<std::pair<std::__cxx11::string_const,nite::Color>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(this->uniforms).colors,&(uniforms->colors)._M_h);
        }
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
  this->ref = ref;
  return;
}

Assistant:

Program(int id, Uniform uniforms, const String &name, nite::Shader *ref){
				this->id = id;
				this->uniforms = uniforms;
				this->shaderName = name;
				this->ref = ref;
			}